

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarView::QCalendarView(QCalendarView *this,QWidget *parent)

{
  QHeaderView *pQVar1;
  QTableView *in_RSI;
  QWidget *in_RDI;
  QTableView *unaff_retaddr;
  QWidget *pQVar2;
  ScrollBarPolicy policy;
  
  pQVar2 = in_RDI;
  QTableView::QTableView(unaff_retaddr,in_RDI);
  policy = (ScrollBarPolicy)((ulong)pQVar2 >> 0x20);
  *(undefined ***)in_RDI = &PTR_metaObject_00d0f3c8;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QCalendarView_00d0f6d8;
  in_RDI[1].super_QObject = (QObject)0x0;
  in_RDI[1].field_0x1 = 0;
  QAbstractItemView::setTabKeyNavigation
            (&in_RSI->super_QAbstractItemView,SUB81((ulong)in_RDI >> 0x38,0));
  QTableView::setShowGrid(in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  pQVar1 = QTableView::verticalHeader(in_RSI);
  (**(code **)(*(long *)&(pQVar1->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x68))(pQVar1,0);
  pQVar1 = QTableView::horizontalHeader(in_RSI);
  (**(code **)(*(long *)&(pQVar1->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x68))(pQVar1,0);
  QAbstractScrollArea::setHorizontalScrollBarPolicy((QAbstractScrollArea *)unaff_retaddr,policy);
  QAbstractScrollArea::setVerticalScrollBarPolicy((QAbstractScrollArea *)unaff_retaddr,policy);
  return;
}

Assistant:

QCalendarView::QCalendarView(QWidget *parent)
    : QTableView(parent),
    readOnly(false),
    validDateClicked(false)
{
    setTabKeyNavigation(false);
    setShowGrid(false);
    verticalHeader()->setVisible(false);
    horizontalHeader()->setVisible(false);
    setHorizontalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
    setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
}